

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void __thiscall TCMallocGuard::TCMallocGuard(TCMallocGuard *this)

{
  int iVar1;
  void *pvVar2;
  
  iVar1 = tcmallocguard_refcount;
  tcmallocguard_refcount = tcmallocguard_refcount + 1;
  if (0 < iVar1) {
    return;
  }
  MallocExtension::instance();
  pvVar2 = tc_malloc(1);
  operator_delete__(pvVar2);
  tcmalloc::ThreadCachePtr::InitThreadCachePtrLate();
  pvVar2 = tc_malloc(1);
  operator_delete__(pvVar2);
  return;
}

Assistant:

TCMallocGuard::TCMallocGuard() {
  if (tcmallocguard_refcount++ > 0) {
    return;
  }

#ifndef WIN32_OVERRIDE_ALLOCATORS
  ReplaceSystemAlloc();    // defined in libc_override_*.h
  (void)MallocExtension::instance(); // make sure malloc extension is constructed
  tc_free(tc_malloc(1));
#endif  // !WIN32_OVERRIDE_ALLOCATORS

  ThreadCachePtr::InitThreadCachePtrLate();
  tc_free(tc_malloc(1));
}